

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_main_loop__pulse(ma_device *pDevice)

{
  ma_uint32 mVar1;
  int iVar2;
  ulong uVar3;
  ma_result mVar4;
  ma_device_type mVar5;
  uint uVar6;
  ma_result mVar7;
  ma_pa_operation *pOP;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  ma_uint32 framesToWriteThisIteration;
  int iVar11;
  uint uVar12;
  ma_uint32 mVar13;
  bool bVar14;
  ma_uint64 capturedClientFramesToProcessThisIteration;
  uint local_4070;
  ma_uint32 capturedDeviceFramesToProcess;
  undefined8 local_4068;
  ma_uint64 convertedDeviceFrameCount;
  ma_uint64 convertedClientFrameCount;
  ma_uint64 capturedDeviceFramesToProcessThisIteration;
  ma_data_converter *local_4048;
  ma_data_converter *local_4040;
  ma_uint8 capturedDeviceData [4096];
  ma_uint8 playbackDeviceData [4096];
  ma_uint8 playbackClientData [4096];
  ma_uint8 capturedClientData [4096];
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4eab,"ma_result ma_device_main_loop__pulse(ma_device *)");
  }
  mVar5 = pDevice->type;
  if ((mVar5 & ~ma_device_type_playback) == ma_device_type_capture) {
    mVar4 = ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,0);
    if (mVar4 != 0) {
      return mVar4;
    }
    mVar5 = pDevice->type;
  }
  if (((mVar5 | ma_device_type_capture) == ma_device_type_duplex) &&
     (mVar4 = ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,0), mVar4 != 0)) {
    return mVar4;
  }
  local_4048 = &(pDevice->capture).converter;
  local_4040 = &(pDevice->playback).converter;
  uVar10 = 0;
  mVar4 = 0;
LAB_0010c28c:
  do {
    bVar14 = (int)uVar10 == 0;
    do {
      if ((pDevice->state != 2) || (!bVar14)) {
        mVar5 = pDevice->type;
        if ((mVar5 & ~ma_device_type_playback) == ma_device_type_capture) {
          mVar7 = ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,1);
          if (mVar7 != 0) {
            return mVar4;
          }
          mVar5 = pDevice->type;
        }
        if ((mVar5 | ma_device_type_capture) != ma_device_type_duplex) {
          return mVar4;
        }
        pOP = (ma_pa_operation *)
              (*(pDevice->pContext->field_21).alsa.snd_pcm_state)
                        ((pDevice->field_23).pulse.pStreamPlayback,
                         ma_pulse_operation_complete_callback,capturedDeviceData);
        if (pOP != (ma_pa_operation *)0x0) {
          ma_device__wait_for_operation__pulse(pDevice,pOP);
          (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pOP);
        }
        ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,1);
        return mVar4;
      }
      mVar5 = pDevice->type;
      if (mVar5 == ma_device_type_playback) {
        uVar6 = (pDevice->playback).internalPeriodSizeInFrames;
        uVar8 = (uint)(0x1000 / (ulong)(*(int *)(&DAT_001127b0 +
                                                (ulong)(pDevice->playback).internalFormat * 4) *
                                       (pDevice->playback).internalChannels));
        uVar9 = 0;
        mVar7 = mVar4;
        goto LAB_0010c4d5;
      }
      if (mVar5 == ma_device_type_capture) {
        uVar6 = (pDevice->capture).internalPeriodSizeInFrames;
        iVar2 = *(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).internalFormat * 4);
        mVar1 = (pDevice->capture).internalChannels;
        uVar8 = 0;
        goto LAB_0010c558;
      }
      bVar14 = true;
    } while (mVar5 != ma_device_type_duplex);
    uVar6 = (pDevice->capture).internalPeriodSizeInFrames;
    local_4070 = (pDevice->playback).internalPeriodSizeInFrames;
    if (uVar6 < local_4070) {
      local_4070 = uVar6;
    }
    uVar6 = 0;
    uVar10 = 0;
    while( true ) {
      uVar8 = local_4070 - uVar6;
      if (local_4070 < uVar6 || uVar8 == 0) break;
      mVar1 = (pDevice->playback).internalChannels;
      iVar2 = *(int *)(&DAT_001127b0 + (ulong)(pDevice->playback).internalFormat * 4);
      uVar9 = (uint)(0x1000 / (ulong)(*(int *)(&DAT_001127b0 +
                                              (ulong)(pDevice->capture).internalFormat * 4) *
                                     (pDevice->capture).internalChannels));
      if (uVar9 <= uVar8) {
        uVar8 = uVar9;
      }
      local_4068 = uVar10;
      mVar4 = ma_device_read__pulse(pDevice,capturedDeviceData,uVar8,&capturedDeviceFramesToProcess)
      ;
      if (mVar4 != 0) {
        uVar10 = 1;
        break;
      }
      iVar11 = 0;
      mVar13 = capturedDeviceFramesToProcess;
      while( true ) {
        uVar3 = 0x1000 / (ulong)(*(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).format * 4) *
                                (pDevice->capture).channels);
        capturedClientFramesToProcessThisIteration =
             0x1000 / (ulong)(*(int *)(&DAT_001127b0 + (ulong)(pDevice->playback).format * 4) *
                             (pDevice->playback).channels);
        if ((uint)uVar3 < (uint)capturedClientFramesToProcessThisIteration) {
          capturedClientFramesToProcessThisIteration = uVar3;
        }
        capturedDeviceFramesToProcessThisIteration = (ma_uint64)mVar13;
        mVar4 = ma_data_converter_process_pcm_frames
                          (local_4048,
                           capturedDeviceData +
                           (pDevice->capture).internalChannels * iVar11 *
                           *(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).internalFormat * 4),
                           &capturedDeviceFramesToProcessThisIteration,capturedClientData,
                           &capturedClientFramesToProcessThisIteration);
        uVar10 = local_4068;
        if (mVar4 != 0) goto LAB_0010c486;
        if (capturedClientFramesToProcessThisIteration == 0) break;
        ma_device__on_data(pDevice,playbackClientData,capturedClientData,
                           (ma_uint32)capturedClientFramesToProcessThisIteration);
        iVar11 = iVar11 + (int)capturedDeviceFramesToProcessThisIteration;
        mVar13 = mVar13 - (int)capturedDeviceFramesToProcessThisIteration;
        do {
          convertedDeviceFrameCount = 0x1000 / (ulong)(iVar2 * mVar1);
          convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
          mVar4 = ma_data_converter_process_pcm_frames
                            (local_4040,playbackClientData,&convertedClientFrameCount,
                             playbackDeviceData,&convertedDeviceFrameCount);
          if (mVar4 != 0) {
LAB_0010c479:
            uVar10 = 1;
            goto LAB_0010c486;
          }
          mVar4 = ma_device_write__pulse
                            (pDevice,playbackDeviceData,(ma_uint32)convertedDeviceFrameCount,
                             (ma_uint32 *)0x0);
          if (mVar4 != 0) goto LAB_0010c479;
          capturedClientFramesToProcessThisIteration =
               capturedClientFramesToProcessThisIteration - (convertedClientFrameCount & 0xffffffff)
          ;
        } while (capturedClientFramesToProcessThisIteration != 0);
      }
      mVar4 = 0;
LAB_0010c486:
      uVar6 = uVar6 + iVar11;
    }
  } while( true );
  while( true ) {
    if (uVar8 <= uVar12) {
      uVar12 = uVar8;
    }
    ma_device__read_frames_from_client(pDevice,uVar12,capturedDeviceData);
    mVar4 = ma_device_write__pulse
                      (pDevice,capturedDeviceData,uVar12,(ma_uint32 *)playbackDeviceData);
    uVar9 = uVar9 + playbackDeviceData._0_4_;
    mVar7 = 0;
    if (mVar4 != 0) break;
LAB_0010c4d5:
    uVar12 = uVar6 - uVar9;
    mVar4 = mVar7;
    if (uVar6 < uVar9 || uVar12 == 0) goto LAB_0010c59d;
  }
  uVar10 = 1;
  goto LAB_0010c28c;
LAB_0010c558:
  uVar9 = uVar6 - uVar8;
  if (uVar6 < uVar8 || uVar9 == 0) goto LAB_0010c59d;
  uVar12 = (uint)(0x1000 / (ulong)(iVar2 * mVar1));
  if (uVar12 <= uVar9) {
    uVar9 = uVar12;
  }
  mVar4 = ma_device_read__pulse(pDevice,capturedDeviceData,uVar9,(ma_uint32 *)playbackDeviceData);
  if (mVar4 != 0) {
    uVar10 = 1;
    goto LAB_0010c28c;
  }
  ma_device__send_frames_to_client(pDevice,playbackDeviceData._0_4_,capturedDeviceData);
  uVar8 = uVar8 + playbackDeviceData._0_4_;
  mVar4 = 0;
  goto LAB_0010c558;
LAB_0010c59d:
  uVar10 = 0;
  goto LAB_0010c28c;
}

Assistant:

static ma_result ma_device_main_loop__pulse(ma_device* pDevice)
{
    ma_result result = MA_SUCCESS;
    ma_bool32 exitLoop = MA_FALSE;

    MA_ASSERT(pDevice != NULL);

    /* The stream needs to be uncorked first. We do this at the top for both capture and playback for PulseAudio. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_capture, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_playback, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }


    while (ma_device__get_state(pDevice) == MA_STATE_STARTED && !exitLoop) {
        switch (pDevice->type)
        {
            case ma_device_type_duplex:
            {
                /* The process is: device_read -> convert -> callback -> convert -> device_write */
                ma_uint32 totalCapturedDeviceFramesProcessed = 0;
                ma_uint32 capturedDevicePeriodSizeInFrames = ma_min(pDevice->capture.internalPeriodSizeInFrames, pDevice->playback.internalPeriodSizeInFrames);
                    
                while (totalCapturedDeviceFramesProcessed < capturedDevicePeriodSizeInFrames) {
                    ma_uint8  capturedDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint8  playbackDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 capturedDeviceDataCapInFrames = sizeof(capturedDeviceData) / ma_get_bytes_per_frame(pDevice->capture.internalFormat,  pDevice->capture.internalChannels);
                    ma_uint32 playbackDeviceDataCapInFrames = sizeof(playbackDeviceData) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    ma_uint32 capturedDeviceFramesRemaining;
                    ma_uint32 capturedDeviceFramesProcessed;
                    ma_uint32 capturedDeviceFramesToProcess;
                    ma_uint32 capturedDeviceFramesToTryProcessing = capturedDevicePeriodSizeInFrames - totalCapturedDeviceFramesProcessed;
                    if (capturedDeviceFramesToTryProcessing > capturedDeviceDataCapInFrames) {
                        capturedDeviceFramesToTryProcessing = capturedDeviceDataCapInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, capturedDeviceData, capturedDeviceFramesToTryProcessing, &capturedDeviceFramesToProcess);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    capturedDeviceFramesRemaining = capturedDeviceFramesToProcess;
                    capturedDeviceFramesProcessed = 0;

                    for (;;) {
                        ma_uint8  capturedClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint8  playbackClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint32 capturedClientDataCapInFrames = sizeof(capturedClientData) / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
                        ma_uint32 playbackClientDataCapInFrames = sizeof(playbackClientData) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
                        ma_uint64 capturedClientFramesToProcessThisIteration = ma_min(capturedClientDataCapInFrames, playbackClientDataCapInFrames);
                        ma_uint64 capturedDeviceFramesToProcessThisIteration = capturedDeviceFramesRemaining;
                        ma_uint8* pRunningCapturedDeviceFrames = ma_offset_ptr(capturedDeviceData, capturedDeviceFramesProcessed * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));

                        /* Convert capture data from device format to client format. */
                        result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningCapturedDeviceFrames, &capturedDeviceFramesToProcessThisIteration, capturedClientData, &capturedClientFramesToProcessThisIteration);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        /*
                        If we weren't able to generate any output frames it must mean we've exhaused all of our input. The only time this would not be the case is if capturedClientData was too small
                        which should never be the case when it's of the size MA_DATA_CONVERTER_STACK_BUFFER_SIZE.
                        */
                        if (capturedClientFramesToProcessThisIteration == 0) {
                            break;
                        }

                        ma_device__on_data(pDevice, playbackClientData, capturedClientData, (ma_uint32)capturedClientFramesToProcessThisIteration);    /* Safe cast .*/

                        capturedDeviceFramesProcessed += (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */
                        capturedDeviceFramesRemaining -= (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */

                        /* At this point the playbackClientData buffer should be holding data that needs to be written to the device. */
                        for (;;) {
                            ma_uint64 convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
                            ma_uint64 convertedDeviceFrameCount = playbackDeviceDataCapInFrames;
                            result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, playbackClientData, &convertedClientFrameCount, playbackDeviceData, &convertedDeviceFrameCount);
                            if (result != MA_SUCCESS) {
                                break;
                            }

                            result = ma_device_write__pulse(pDevice, playbackDeviceData, (ma_uint32)convertedDeviceFrameCount, NULL);   /* Safe cast. */
                            if (result != MA_SUCCESS) {
                                exitLoop = MA_TRUE;
                                break;
                            }

                            capturedClientFramesToProcessThisIteration -= (ma_uint32)convertedClientFrameCount;  /* Safe cast. */
                            if (capturedClientFramesToProcessThisIteration == 0) {
                                break;
                            }
                        }

                        /* In case an error happened from ma_device_write__pulse()... */
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }
                    }

                    totalCapturedDeviceFramesProcessed += capturedDeviceFramesProcessed;
                }
            } break;

            case ma_device_type_capture:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->capture.internalPeriodSizeInFrames;
                ma_uint32 framesReadThisPeriod = 0;
                while (framesReadThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesReadThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToReadThisIteration = framesRemainingInPeriod;
                    if (framesToReadThisIteration > intermediaryBufferSizeInFrames) {
                        framesToReadThisIteration = intermediaryBufferSizeInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, intermediaryBuffer, framesToReadThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    ma_device__send_frames_to_client(pDevice, framesProcessed, intermediaryBuffer);

                    framesReadThisPeriod += framesProcessed;
                }
            } break;

            case ma_device_type_playback:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->playback.internalPeriodSizeInFrames;
                ma_uint32 framesWrittenThisPeriod = 0;
                while (framesWrittenThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesWrittenThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToWriteThisIteration = framesRemainingInPeriod;
                    if (framesToWriteThisIteration > intermediaryBufferSizeInFrames) {
                        framesToWriteThisIteration = intermediaryBufferSizeInFrames;
                    }

                    ma_device__read_frames_from_client(pDevice, framesToWriteThisIteration, intermediaryBuffer);

                    result = ma_device_write__pulse(pDevice, intermediaryBuffer, framesToWriteThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    framesWrittenThisPeriod += framesProcessed;
                }
            } break;

            /* To silence a warning. Will never hit this. */
            case ma_device_type_loopback:
            default: break;
        }
    }

    /* Here is where the device needs to be stopped. */
    ma_device_stop__pulse(pDevice);

    return result;
}